

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Identifier __thiscall soul::StructuralParser::parseIdentifier(StructuralParser *this)

{
  Allocator *pAVar1;
  Identifier IVar2;
  string_view newString;
  string local_30;
  
  pAVar1 = this->allocator;
  Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>::
  readIdentifier_abi_cxx11_
            (&local_30,
             (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              *)this);
  newString._M_str = local_30._M_dataplus._M_p;
  newString._M_len = local_30._M_string_length;
  IVar2 = Identifier::Pool::get(&pAVar1->identifiers,newString);
  std::__cxx11::string::~string((string *)&local_30);
  return (Identifier)IVar2.name;
}

Assistant:

Identifier parseIdentifier()
    {
        return allocator.identifiers.get (readIdentifier());
    }